

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mnist-common.cpp
# Opt level: O2

ggml_opt_result_t mnist_model_eval(mnist_model *model,ggml_opt_dataset_t dataset)

{
  ggml_opt_result_t pgVar1;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ggml_opt_params params;
  
  pgVar1 = (ggml_opt_result_t)ggml_opt_result_init();
  ggml_opt_default_params
            (&params,model->backend_sched,model->ctx_compute,model->images,model->logits,2);
  params.build_type = GGML_OPT_BUILD_TYPE_FORWARD;
  uVar2 = ggml_opt_init();
  lVar3 = ggml_time_us();
  ggml_opt_epoch(uVar2,dataset,0,pgVar1,0,0,0,params.ctx_compute._0_4_,params.inputs._0_4_,
                 params.outputs._0_4_,params.loss_type,params.opt_period,params.get_opt_pars._0_4_,
                 params.get_opt_pars_ud._0_4_);
  lVar4 = ggml_time_us();
  lVar5 = ggml_opt_dataset_data(dataset);
  fprintf(_stderr,"%s: model evaluation on %d images took %.2lf ms, %.2lf us/image\n",
          SUB84((double)(lVar4 - lVar3) * 0.001,0),
          SUB84((double)(lVar4 - lVar3) / (double)*(int *)(lVar5 + 0x18),0),"mnist_model_eval");
  ggml_opt_free(uVar2);
  return pgVar1;
}

Assistant:

ggml_opt_result_t mnist_model_eval(mnist_model & model, ggml_opt_dataset_t dataset) {
    ggml_opt_result_t result = ggml_opt_result_init();

    ggml_opt_params params = ggml_opt_default_params(model.backend_sched, model.ctx_compute, model.images, model.logits, GGML_OPT_LOSS_TYPE_CROSS_ENTROPY);
    params.build_type = GGML_OPT_BUILD_TYPE_FORWARD;
    ggml_opt_context_t opt_ctx = ggml_opt_init(params);

    {
        const int64_t t_start_us = ggml_time_us();

        ggml_opt_epoch(opt_ctx, dataset, nullptr, result, /*idata_split =*/ 0, nullptr, nullptr);

        const int64_t t_total_us = ggml_time_us() - t_start_us;
        const double t_total_ms = 1e-3*t_total_us;
        const int nex = ggml_opt_dataset_data(dataset)->ne[1];
        fprintf(stderr, "%s: model evaluation on %d images took %.2lf ms, %.2lf us/image\n",
                __func__, nex, t_total_ms, (double) t_total_us/nex);
    }

    ggml_opt_free(opt_ctx);

    return result;
}